

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O2

void __thiscall S2RegionTermIndexer::~S2RegionTermIndexer(S2RegionTermIndexer *this)

{
  S2RegionCoverer::~S2RegionCoverer(&this->coverer_);
  std::__cxx11::string::~string((string *)&(this->options_).marker_);
  return;
}

Assistant:

S2RegionTermIndexer::~S2RegionTermIndexer() = default;